

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator * __thiscall
QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::
emplace_helper<std::pair<unsigned_int,QMetaObject_const*>>
          (iterator *__return_storage_ptr__,
          QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *this,QObject **key,
          pair<unsigned_int,_const_QMetaObject_*> *args)

{
  byte bVar1;
  Entry *pEVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::MultiNode<QObject*,std::pair<unsigned_int,QMetaObject_const*>>>::
  findOrInsert<QObject*>
            ((InsertionResult *)local_58,
             *(Data<QHashPrivate::MultiNode<QObject*,std::pair<unsigned_int,QMetaObject_const*>>> **
              )this,key);
  pEVar2 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
          [(uint)local_58._8_8_ & 0x7f];
  if (local_58[0x10] == false) {
    puVar7 = (uint *)operator_new(0x18);
    uVar4 = *(uint *)&args->field_0x4;
    uVar5 = *(uint *)&args->second;
    uVar6 = *(uint *)((long)&args->second + 4);
    *puVar7 = args->first;
    puVar7[1] = uVar4;
    puVar7[2] = uVar5;
    puVar7[3] = uVar6;
    puVar7[4] = 0;
    puVar7[5] = 0;
    *(QObject **)pEVar2[bVar1].storage.data = *key;
    *(uint **)(pEVar2[bVar1].storage.data + 8) = puVar7;
  }
  else {
    puVar7 = (uint *)operator_new(0x18);
    uVar4 = *(uint *)&args->field_0x4;
    uVar5 = *(uint *)&args->second;
    uVar6 = *(uint *)((long)&args->second + 4);
    *puVar7 = args->first;
    puVar7[1] = uVar4;
    puVar7[2] = uVar5;
    puVar7[3] = uVar6;
    puVar7[4] = 0;
    puVar7[5] = 0;
    uVar3 = *(undefined8 *)(pEVar2[bVar1].storage.data + 8);
    *(uint **)(pEVar2[bVar1].storage.data + 8) = puVar7;
    *(undefined8 *)(puVar7 + 4) = uVar3;
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  (__return_storage_ptr__->i).d =
       (Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_> *)
       local_58._0_8_;
  (__return_storage_ptr__->i).bucket = local_58._8_8_;
  __return_storage_ptr__->e = (Chain **)0x0;
  if ((Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_> *)
      local_58._0_8_ !=
      (Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_> *)
      0x0) {
    __return_storage_ptr__->e =
         (Chain **)
         ((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
          [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
           [(uint)local_58._8_8_ & 0x7f]].storage.data + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }